

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_script.cpp
# Opt level: O3

int CfdFreeMultisigScriptSigHandle(void *handle,void *multisig_handle)

{
  string local_40;
  
  cfd::Initialize();
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"MultiScriptSig","");
  cfd::capi::FreeBuffer(multisig_handle,&local_40,0x15cc);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return 0;
}

Assistant:

int CfdFreeMultisigScriptSigHandle(void* handle, void* multisig_handle) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    FreeBuffer(
        multisig_handle, kPrefixMultisigScriptSig,
        sizeof(CfdCapiMultisigScriptSigData));
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}